

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square_tm.hpp
# Opt level: O2

result_t *
ising::free_energy::square::transfer_matrix<double>::calc
          (result_t *__return_storage_ptr__,uint_t Lx,uint_t Ly,real_t Jx,real_t Jy,real_t beta,
          real_t h)

{
  uint_t uVar1;
  size_type sVar2;
  invalid_argument *this;
  size_type __n;
  uint_t j;
  size_type sVar3;
  long lVar4;
  bool bVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar6;
  value_type_conflict vVar7;
  undefined1 auVar8 [16];
  double y;
  exp_number<double> local_2a0;
  exp_number factor;
  exp_number sum;
  self_ res;
  exp_number sum_10;
  exp_number sum_02;
  exp_number sum_01;
  vector<double,_std::allocator<double>_> v_02;
  vector<double,_std::allocator<double>_> v;
  vector<double,_std::allocator<double>_> v_01;
  vector<double,_std::allocator<double>_> v_20;
  vector<double,_std::allocator<double>_> v_10;
  exp_number sum_20;
  vector<double,_std::allocator<double>_> diag_02;
  vector<double,_std::allocator<double>_> diag_01;
  vector<double,_std::allocator<double>_> diag_20;
  vector<double,_std::allocator<double>_> diag_10;
  vector<double,_std::allocator<double>_> vt;
  vector<double,_std::allocator<double>_> diag;
  exp_number local_d0;
  exp_number local_c0;
  exp_number<double> local_b0;
  exp_number<double> local_a0;
  exp_number<double> local_90;
  exp_number<double> local_80;
  exp_number<double> local_70;
  exp_number<double> local_60;
  exp_number<double> local_50;
  exp_number<double> local_40;
  
  if ((Lx == 0) || (Ly == 0)) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Lx and Ly should be positive");
  }
  else {
    if (0.0 < beta) {
      __n = (size_type)(1 << ((byte)Ly & 0x1f));
      std::vector<double,_std::allocator<double>_>::vector(&diag,__n,(allocator_type *)&diag_10);
      std::vector<double,_std::allocator<double>_>::vector(&diag_10,__n,(allocator_type *)&diag_20);
      std::vector<double,_std::allocator<double>_>::vector(&diag_20,__n,(allocator_type *)&diag_01);
      std::vector<double,_std::allocator<double>_>::vector(&diag_01,__n,(allocator_type *)&diag_02);
      std::vector<double,_std::allocator<double>_>::vector(&diag_02,__n,(allocator_type *)&v);
      fill_D(Ly,Jy,beta,h,&diag,&diag_10,&diag_20,&diag_01,&diag_02);
      sum.sign_ = 0;
      sum.log_ = 0.0;
      sum_10.sign_ = 0;
      sum_10.log_ = 0.0;
      sum_20.sign_ = 0;
      sum_20.log_ = 0.0;
      sum_01.sign_ = 0;
      sum_01.log_ = 0.0;
      sum_02.sign_ = 0;
      sum_02.log_ = 0.0;
      std::vector<double,_std::allocator<double>_>::vector(&v,__n,(allocator_type *)&v_10);
      std::vector<double,_std::allocator<double>_>::vector(&v_10,__n,(allocator_type *)&v_20);
      std::vector<double,_std::allocator<double>_>::vector(&v_20,__n,(allocator_type *)&v_01);
      std::vector<double,_std::allocator<double>_>::vector(&v_01,__n,(allocator_type *)&v_02);
      std::vector<double,_std::allocator<double>_>::vector(&v_02,__n,(allocator_type *)&vt);
      std::vector<double,_std::allocator<double>_>::vector(&vt,__n,(allocator_type *)&factor);
      dVar6 = extraout_XMM0_Qa;
      for (sVar2 = 0; sVar2 != __n; sVar2 = sVar2 + 1) {
        factor.sign_ = 1;
        factor.log_ = 0.0;
        for (sVar3 = 0; __n != sVar3; sVar3 = sVar3 + 1) {
          v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[sVar3] = 0.0;
          v_10.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[sVar3] = 0.0;
          v_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[sVar3] = 0.0;
          v_01.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[sVar3] = 0.0;
          v_02.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[sVar3] = 0.0;
        }
        v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[sVar2] = 1.0;
        uVar1 = Lx;
        while (bVar5 = uVar1 != 0, uVar1 = uVar1 - 1, bVar5) {
          local_c0.log_ = factor.log_;
          local_c0.sign_ = factor.sign_;
          product_D((transfer_matrix<double> *)&local_2a0,&diag,&diag_10,&diag_20,&diag_01,&diag_02,
                    &local_c0,&v,&v_10,&v_20,&v_01,&v_02);
          factor.sign_ = local_2a0.sign_;
          factor.log_ = local_2a0.log_;
          local_d0.log_ = local_2a0.log_;
          local_d0.sign_ = local_2a0.sign_;
          product_U((transfer_matrix<double> *)&local_2a0,Ly,Jx,beta,&local_d0,&v,&v_10,&v_20,&v_01,
                    &v_02,&vt);
          factor.sign_ = local_2a0.sign_;
          factor.log_ = local_2a0.log_;
        }
        standards::operator*
                  ((standards *)&local_2a0,&factor,
                   v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar2]);
        standards::exp_number<double>::operator+=(&sum,&local_2a0);
        standards::operator*
                  ((standards *)&local_2a0,&factor,
                   v_10.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar2]);
        standards::exp_number<double>::operator+=(&sum_10,&local_2a0);
        standards::operator*
                  ((standards *)&local_2a0,&factor,
                   v_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar2]);
        standards::exp_number<double>::operator+=(&sum_20,&local_2a0);
        standards::operator*
                  ((standards *)&local_2a0,&factor,
                   v_01.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar2]);
        standards::exp_number<double>::operator+=(&sum_01,&local_2a0);
        standards::operator*
                  ((standards *)&local_2a0,&factor,
                   v_02.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar2]);
        standards::exp_number<double>::operator+=(&sum_02,&local_2a0);
        dVar6 = extraout_XMM0_Qa_00;
      }
      dVar6 = standards::exp_number<double>::log(&sum,dVar6);
      lVar4 = Ly * Lx;
      auVar8._8_4_ = (int)((ulong)lVar4 >> 0x20);
      auVar8._0_8_ = lVar4;
      auVar8._12_4_ = 0x45300000;
      y = ((auVar8._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) * beta;
      __return_storage_ptr__->derivatives_[0][0] = -dVar6 / y;
      dVar6 = standards::exp_number<double>::log(&sum,-dVar6 / y);
      standards::operator/<double,_double>((standards *)&res,&sum_10,&sum);
      standards::operator-((standards *)&local_2a0,dVar6 / beta,&res);
      standards::operator/((standards *)&factor,&local_2a0,y);
      vVar7 = standards::exp_number::operator_cast_to_double((exp_number *)&factor);
      __return_storage_ptr__->derivatives_[1][0] = vVar7;
      dVar6 = standards::exp_number<double>::log(&sum,vVar7);
      standards::operator/<double,_double>((standards *)&local_60,&sum_10,&sum);
      standards::operator/((standards *)&local_50,&local_60,beta);
      standards::operator*((standards *)&local_40,2,&local_50);
      standards::operator+((standards *)&res,((dVar6 * -2.0) / beta) / beta,&local_40);
      standards::operator*<double,_double>((standards *)&local_a0,&sum_20,&sum);
      standards::operator*<double,_double>((standards *)&local_b0,&sum_10,&sum_10);
      standards::operator-<double,_double>((standards *)&local_90,&local_a0,&local_b0);
      standards::operator/<double,_double>((standards *)&local_80,&local_90,&sum);
      standards::operator/<double,_double>((standards *)&local_70,&local_80,&sum);
      standards::operator-<double,_double>((standards *)&local_2a0,&res,&local_70);
      standards::operator/((standards *)&factor,&local_2a0,y);
      vVar7 = standards::exp_number::operator_cast_to_double((exp_number *)&factor);
      __return_storage_ptr__->derivatives_[2][0] = vVar7;
      res.log_ = sum_01.log_;
      res.sign_ = -sum_01.sign_;
      standards::operator/<double,_double>((standards *)&local_2a0,&res,&sum);
      standards::operator/((standards *)&factor,&local_2a0,y);
      vVar7 = standards::exp_number::operator_cast_to_double((exp_number *)&factor);
      __return_storage_ptr__->derivatives_[0][1] = vVar7;
      res.log_ = sum_02.log_;
      res.sign_ = -sum_02.sign_;
      standards::operator/<double,_double>((standards *)&local_2a0,&res,&sum);
      standards::operator/((standards *)&factor,&local_2a0,y);
      vVar7 = standards::exp_number::operator_cast_to_double((exp_number *)&factor);
      __return_storage_ptr__->derivatives_[0][2] = vVar7;
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&vt.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&v_02.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&v_01.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&v_20.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&v_10.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&v.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&diag_02.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&diag_01.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&diag_20.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&diag_10.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&diag.super__Vector_base<double,_std::allocator<double>_>);
      return __return_storage_ptr__;
    }
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"beta should be positive");
  }
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

static result_t calc(uint_t Lx, uint_t Ly, real_t Jx, real_t Jy, real_t beta,
                       real_t h) {
    if (Lx == 0 || Ly == 0)
      throw(std::invalid_argument("Lx and Ly should be positive"));
    if (beta <= 0)
      throw(std::invalid_argument("beta should be positive"));
    uint_t dim = 1 << Ly;

    std::vector<real_t> diag(dim), diag_10(dim), diag_20(dim), diag_01(dim),
        diag_02(dim);
    fill_D(Ly, Jy, beta, h, diag, diag_10, diag_20, diag_01, diag_02);

    result_t res;
    exp_number sum = 0;
    exp_number sum_10 = 0;
    exp_number sum_20 = 0;
    exp_number sum_01 = 0;
    exp_number sum_02 = 0;
    std::vector<real_t> v(dim), v_10(dim), v_20(dim), v_01(dim), v_02(dim),
        vt(dim);
    for (uint_t i = 0; i < dim; ++i) {
      exp_number factor = 1;
      for (uint_t j = 0; j < dim; ++j) {
        v[j] = 0;
        v_10[j] = 0;
        v_20[j] = 0;
        v_01[j] = 0;
        v_02[j] = 0;
      }
      v[i] = 1;
      for (uint_t x = 0; x < Lx; ++x) {
        factor = transfer_matrix<real_t>::product_D(diag, diag_10, diag_20,
                                                    diag_01, diag_02, factor, v,
                                                    v_10, v_20, v_01, v_02);
        factor = transfer_matrix<real_t>::product_U(Ly, Jx, beta, factor, v,
                                                    v_10, v_20, v_01, v_02, vt);
      }
      sum += factor * v[i];
      sum_10 += factor * v_10[i];
      sum_20 += factor * v_20[i];
      sum_01 += factor * v_01[i];
      sum_02 += factor * v_02[i];
    }
    res.set(0, 0, -log(sum) / (Lx * Ly * beta));
    res.set(1, 0, ((log(sum) / beta) - (sum_10 / sum)) / (Lx * Ly * beta));
    res.set(2, 0,
            (-(2 * log(sum) / beta / beta) + 2 * (sum_10 / sum / beta) -
             ((sum_20 * sum - sum_10 * sum_10) / sum / sum)) /
                (Lx * Ly * beta));
    res.set(0, 1, -sum_01 / sum / (Lx * Ly * beta));
    res.set(0, 2, -sum_02 / sum / (Lx * Ly * beta));
    return res;
  }